

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_slookup(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  skill_type *psVar4;
  char *__s;
  char arg [4608];
  char buf [4608];
  char local_2428 [4608];
  char local_1228 [4608];
  
  one_argument(argument,local_2428);
  if (local_2428[0] == '\0') {
    __s = "Lookup which skill or spell?\n\r";
  }
  else {
    bVar1 = str_cmp(local_2428,"all");
    if (!bVar1) {
      psVar4 = skill_table;
      uVar3 = 0;
      while( true ) {
        if (uVar3 == 800) {
          return;
        }
        if (psVar4->name == (char *)0x0) break;
        sprintf(local_1228,"Sn: %3d  Skill/spell: \'%s\'\n\r",uVar3 & 0xffffffff);
        send_to_char(local_1228,ch);
        uVar3 = uVar3 + 1;
        psVar4 = psVar4 + 1;
      }
      return;
    }
    uVar2 = skill_lookup(local_2428);
    if ((int)uVar2 < 0) {
      __s = "No such skill or spell.\n\r";
    }
    else {
      __s = local_1228;
      sprintf(__s,"Sn: %3d  Skill/spell: \'%s\'\n\r",(ulong)uVar2,skill_table[uVar2].name);
    }
  }
  send_to_char(__s,ch);
  return;
}

Assistant:

void do_slookup(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	int sn;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Lookup which skill or spell?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		for (sn = 0; sn < MAX_SKILL; sn++)
		{
			if (skill_table[sn].name == nullptr)
				break;

			sprintf(buf, "Sn: %3d  Skill/spell: '%s'\n\r", sn, skill_table[sn].name);
			send_to_char(buf, ch);
		}
	}
	else
	{
		sn = skill_lookup(arg);

		if (sn < 0)
		{
			send_to_char("No such skill or spell.\n\r", ch);
			return;
		}

		sprintf(buf, "Sn: %3d  Skill/spell: '%s'\n\r", sn, skill_table[sn].name);
		send_to_char(buf, ch);
	}
}